

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.h
# Opt level: O2

void __thiscall
ON_DocumentUserStringList::ON_DocumentUserStringList
          (ON_DocumentUserStringList *this,ON_DocumentUserStringList *param_1)

{
  ON_Object::ON_Object(&this->super_ON_Object,&param_1->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_0082e248;
  return;
}

Assistant:

class ON_CLASS ON_DocumentUserStringList : public ON_Object
{
  ON_OBJECT_DECLARE(ON_DocumentUserStringList);
public:
  ON_DocumentUserStringList();
  ~ON_DocumentUserStringList();

  bool IsValid( class ON_TextLog* text_log = nullptr ) const override;
  void Dump( ON_TextLog& ) const override;
  ON__UINT32 DataCRC(ON__UINT32 current_remainder) const override;
  bool Write(ON_BinaryArchive& binary_archive) const override;
  bool Read(ON_BinaryArchive& binary_archive) override;

  // Use the
  //   ON_Object::SetUserString()
  //   ON_Object::GetUserString()
  //   ON_Object::GetUserStrings()
  //   ON_Object::GetUserStringKeys()
  //   ON_Object::UserStringCount()
  // functions to access and modify user string information.
}